

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O2

int mm_read_unsymmetric_sparse(char *fname,int *M_,int *N_,int *nz_,double **val_,int **I_,int **J_)

{
  int iVar1;
  FILE *pFVar2;
  int *piVar3;
  int *piVar4;
  double *pdVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  MM_typecode matcode;
  int nz;
  int N;
  int M;
  double **local_40;
  int **local_38;
  
  local_40 = val_;
  local_38 = I_;
  pFVar2 = fopen(fname,"r");
  iVar7 = -1;
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = mm_read_banner((FILE *)pFVar2,&matcode);
    if (iVar1 == 0) {
      if (((matcode[2] == 'R') && (matcode[0] == 'M')) && (matcode[1] == 'C')) {
        iVar1 = mm_read_mtx_crd_size((FILE *)pFVar2,&M,&N,&nz);
        if (iVar1 == 0) {
          *M_ = M;
          *N_ = N;
          uVar8 = (ulong)nz;
          *nz_ = nz;
          piVar3 = (int *)malloc(uVar8 * 4);
          piVar4 = (int *)malloc(uVar8 * 4);
          pdVar5 = (double *)malloc(uVar8 << 3);
          *local_40 = pdVar5;
          *local_38 = piVar3;
          *J_ = piVar4;
          for (lVar9 = 0; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
            __isoc99_fscanf(pFVar2,"%d %d %lg\n",piVar3,piVar4,pdVar5);
            *piVar3 = *piVar3 + -1;
            *piVar4 = *piVar4 + -1;
            uVar8 = (ulong)(uint)nz;
            pdVar5 = pdVar5 + 1;
            piVar4 = piVar4 + 1;
            piVar3 = piVar3 + 1;
          }
          fclose(pFVar2);
          iVar7 = 0;
        }
        else {
          fwrite("read_unsymmetric_sparse(): could not parse matrix size.\n",0x38,1,_stderr);
        }
      }
      else {
        fwrite("Sorry, this application does not support ",0x29,1,_stderr);
        pFVar2 = _stderr;
        pcVar6 = mm_typecode_to_str(matcode);
        fprintf(pFVar2,"Market Market type: [%s]\n",pcVar6);
      }
    }
    else {
      printf("mm_read_unsymetric: Could not process Matrix Market banner ");
      printf(" in file [%s]\n",fname);
    }
  }
  return iVar7;
}

Assistant:

int mm_read_unsymmetric_sparse(const char *fname, int *M_, int *N_, int *nz_,
                               double **val_, int **I_, int **J_) {
    FILE *f;
    MM_typecode matcode;
    int M, N, nz;
    int i;
    double *val;
    int *I, *J;

    if ((f = fopen(fname, "r")) == NULL)
        return -1;


    if (mm_read_banner(f, &matcode) != 0) {
        printf("mm_read_unsymetric: Could not process Matrix Market banner ");
        printf(" in file [%s]\n", fname);
        return -1;
    }


    if (!(mm_is_real(matcode) && mm_is_matrix(matcode) &&
          mm_is_sparse(matcode))) {
        fprintf(stderr, "Sorry, this application does not support ");
        fprintf(stderr, "Market Market type: [%s]\n",
                mm_typecode_to_str(matcode));
        return -1;
    }

    /* find out size of sparse matrix: M, N, nz .... */

    if (mm_read_mtx_crd_size(f, &M, &N, &nz) != 0) {
        fprintf(stderr, "read_unsymmetric_sparse(): could not parse matrix size.\n");
        return -1;
    }

    *M_ = M;
    *N_ = N;
    *nz_ = nz;

    /* reseve memory for matrices */

    I = (int *) malloc(nz * sizeof(int));
    J = (int *) malloc(nz * sizeof(int));
    val = (double *) malloc(nz * sizeof(double));

    *val_ = val;
    *I_ = I;
    *J_ = J;

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    for (i = 0; i < nz; i++) {
        fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
        I[i]--;  /* adjust from 1-based to 0-based */
        J[i]--;
    }
    fclose(f);

    return 0;
}